

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<unsigned_char,unsigned_long>(char *types)

{
  bool bVar1;
  char *pcVar2;
  string msg_2;
  uchar x;
  string msg_1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uchar ret;
  TestCase<unsigned_char,_unsigned_long,_3> test;
  TestVector<unsigned_char,_unsigned_long,_3> tests;
  unsigned_long in_stack_fffffffffffffd88;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffd90;
  allocator *in_stack_fffffffffffffd98;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffda0;
  undefined8 local_220;
  byte local_210;
  allocator local_201;
  string local_200 [15];
  undefined1 in_stack_fffffffffffffe0f;
  unsigned_long in_stack_fffffffffffffe10;
  uchar in_stack_fffffffffffffe1f;
  string *in_stack_fffffffffffffe20;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_178;
  uchar local_16a;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [37];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_db;
  byte local_da;
  allocator local_d9;
  string local_d8 [55];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [40];
  undefined8 local_38;
  unsigned_long local_30;
  byte local_28;
  TestVector<unsigned_char,_unsigned_long,_3> local_20;
  
  TestVector<unsigned_char,_unsigned_long,_3>::TestVector(&local_20);
  TestVector<unsigned_char,_unsigned_long,_3>::GetNext
            ((TestVector<unsigned_char,_unsigned_long,_3> *)in_stack_fffffffffffffda0.m_int);
  while( true ) {
    bVar1 = TestVector<unsigned_char,_unsigned_long,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<unsigned_char,unsigned_long>
                      ((uchar)((ulong)in_stack_fffffffffffffd90 >> 0x38),in_stack_fffffffffffffd88,
                       (uchar *)0x184cc8);
    if (bVar1 != (bool)(local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Error in case ",&local_a1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar2,&local_d9);
      err_msg<unsigned_char,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe10,
                 (bool)in_stack_fffffffffffffe0f);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::~string(local_60);
    }
    local_da = 1;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_db,(uchar *)&local_38);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if ((local_da & 1) != (local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"Error in case ",&local_141);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,pcVar2,&local_169);
      err_msg<unsigned_char,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe10,
                 (bool)in_stack_fffffffffffffe0f);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::~string(local_100);
    }
    local_da = 1;
    local_16a = (uchar)local_38;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_178,&local_30);
    operator+=((uchar *)in_stack_fffffffffffffd98,in_stack_fffffffffffffda0);
    if ((local_da & 1) != (local_28 & 1)) {
      in_stack_fffffffffffffda0.m_int = (unsigned_long)&stack0xfffffffffffffe27;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"Error in case ",(allocator *)in_stack_fffffffffffffda0.m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe27);
      in_stack_fffffffffffffd90 =
           (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd98 = &local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_200,(char *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      err_msg<unsigned_char,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe10,
                 (bool)in_stack_fffffffffffffe0f);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::__cxx11::string::~string(local_198);
    }
    TestVector<unsigned_char,_unsigned_long,_3>::GetNext
              ((TestVector<unsigned_char,_unsigned_long,_3> *)in_stack_fffffffffffffda0.m_int);
    local_38 = local_220;
    local_28 = local_210;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}